

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_xor(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx;
  uint uVar2;
  uintptr_t o;
  TCGArg a1;
  uint uVar3;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  uVar2 = uVar1 >> 0x15 & 0x1f;
  uVar3 = uVar1 >> 0xb & 0x1f;
  a1 = (long)&tcg_ctx->pool_cur + *(long *)((long)cpu_gpr + (ulong)(uVar1 >> 0xd & 0xf8));
  if (uVar2 == uVar3) {
    tcg_gen_op2_ppc64(tcg_ctx,INDEX_op_movi_i64,a1,0);
  }
  else {
    tcg_gen_op3_ppc64(tcg_ctx,INDEX_op_xor_i64,a1,
                      (TCGArg)((long)&tcg_ctx->pool_cur + (long)cpu_gpr[uVar2]),
                      (TCGArg)((long)&tcg_ctx->pool_cur + (long)cpu_gpr[uVar3]));
  }
  if ((ctx->opcode & 1) != 0) {
    gen_xor_cold_1();
  }
  return;
}

Assistant:

static void gen_xor(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    /* Optimisation for "set to zero" case */
    if (rS(ctx->opcode) != rB(ctx->opcode)) {
        tcg_gen_xor_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], cpu_gpr[rS(ctx->opcode)],
                       cpu_gpr[rB(ctx->opcode)]);
    } else {
        tcg_gen_movi_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], 0);
    }
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rA(ctx->opcode)]);
    }
}